

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

void Abc_NtkRecLibMerge3(Gia_Man_t *pLib)

{
  word *pTruth;
  char cVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Lms_Man_t *pLVar4;
  int v;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Vec_Str_t *__ptr;
  word *pwVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  long lVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int SuppSize;
  ulong uVar17;
  timespec ts;
  char pCanonPerm [16];
  timespec local_98;
  Lms_Man_t *local_88;
  long local_80;
  ulong local_78;
  long local_70;
  Gia_Man_t *local_68;
  long local_60;
  Vec_Str_t *local_58;
  ulong *local_50;
  char local_48 [24];
  
  pLVar4 = s_pMan3;
  pGVar2 = s_pMan3->pGia;
  iVar5 = clock_gettime(3,&local_98);
  if (iVar5 < 0) {
    local_60 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    local_60 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  if (pLib->vCis->nSize == pGVar2->vCis->nSize) {
    local_88 = pLVar4;
    if ((pGVar2->vHTable).nSize == 0) {
      Gia_ManHashStart(pGVar2);
    }
    local_68 = pGVar2;
    __ptr = Lms_GiaSuppSizes(pLib);
    pVVar10 = pLib->vCos;
    if (0 < pVVar10->nSize) {
      pTruth = local_88->pTemp1;
      lVar11 = 0;
      pGVar13 = (Gia_Obj_t *)0x0;
      local_58 = __ptr;
      do {
        iVar5 = pVVar10->pArray[lVar11];
        if (((long)iVar5 < 0) || (pLib->nObjs <= iVar5)) goto LAB_002f710f;
        pGVar3 = pLib->pObjs;
        __ptr = local_58;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        if (local_58->nSize <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        local_78 = (ulong)(uint)(int)local_58->pArray[lVar11];
        local_70 = lVar11;
        if (local_58->pArray[lVar11] < 2) {
          __assert_fail("nLeaves > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x255,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
        }
        iVar6 = clock_gettime(3,&local_98);
        if (iVar6 < 0) {
          lVar11 = 1;
        }
        else {
          lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
          lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_98.tv_sec * -1000000;
        }
        pGVar3 = pGVar3 + iVar5;
        pwVar9 = Gia_ObjComputeTruthTable
                           (pLib,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
        iVar5 = clock_gettime(3,&local_98);
        if (iVar5 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
        }
        local_88->timeTruth = local_88->timeTruth + lVar12 + lVar11;
        iVar5 = clock_gettime(3,&local_98);
        pLVar4 = local_88;
        if (iVar5 < 0) {
          local_80 = 1;
        }
        else {
          lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
          local_80 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_98.tv_sec * -1000000;
        }
        local_50 = pwVar9;
        memcpy(pTruth,pwVar9,(long)local_88->nWords << 3);
        iVar6 = (int)local_78;
        uVar7 = Abc_TtCanonicize(pTruth,iVar6,local_48);
        iVar5 = pLVar4->nVars;
        if (iVar5 != iVar6) {
          if (iVar5 <= iVar6) {
            __assert_fail("nVarS < nVarB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x46e,"void Abc_TtStretch5(unsigned int *, int, int)");
          }
          uVar8 = 1 << ((char)local_78 - 5U & 0x1f);
          if ((char)local_78 < '\x06') {
            uVar8 = 1;
          }
          uVar14 = 1 << ((char)iVar5 - 5U & 0x1f);
          if (iVar5 < 6) {
            uVar14 = 1;
          }
          if (uVar8 != uVar14) {
            if ((int)uVar14 <= (int)uVar8) {
              __assert_fail("step < nWords",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                            ,0x473,"void Abc_TtStretch5(unsigned int *, int, int)");
            }
            if (0 < (int)uVar14) {
              lVar11 = 0;
              pwVar9 = pTruth;
              do {
                if (0 < (int)uVar8) {
                  uVar17 = 0;
                  do {
                    *(undefined4 *)((long)pwVar9 + uVar17 * 4) =
                         *(undefined4 *)((long)pTruth + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar8 != uVar17);
                }
                lVar11 = lVar11 + (int)uVar8;
                pwVar9 = (word *)((long)pwVar9 + (long)(int)uVar8 * 4);
              } while (lVar11 < (long)(ulong)uVar14);
            }
          }
        }
        iVar5 = clock_gettime(3,&local_98);
        pGVar2 = local_68;
        if (iVar5 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
        }
        local_88->timeCanon = local_88->timeCanon + lVar11 + local_80;
        if ((char)local_78 == '\x02') {
          lVar11 = 0;
          pwVar9 = s_Truths6Neg;
          iVar5 = 0;
          do {
            iVar5 = (iVar5 + 1) -
                    (uint)(((*local_50 >> ((byte)(1 << ((byte)lVar11 & 0x1f)) & 0x3f) ^ *local_50) &
                           *pwVar9) == 0);
            lVar11 = lVar11 + 1;
            pwVar9 = pwVar9 + 1;
          } while (lVar11 != 2);
          if (iVar5 == 2) goto LAB_002f6ce0;
        }
        else {
LAB_002f6ce0:
          iVar5 = clock_gettime(3,&local_98);
          if (iVar5 < 0) {
            local_80 = 1;
          }
          else {
            lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
            local_80 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_98.tv_sec * -1000000;
          }
          pVVar10 = pGVar2->vCis;
          uVar8 = pVVar10->nSize;
          uVar14 = uVar8 - pGVar2->nRegs;
          uVar17 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar8 < 1) {
            uVar8 = 0;
          }
          uVar15 = 1;
          if (1 < (int)local_78) {
            uVar15 = local_78 & 0xffffffff;
          }
          uVar16 = 0;
          do {
            if (uVar17 == uVar16) {
              __assert_fail("v < Gia_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
            }
            if (uVar8 == uVar16) {
LAB_002f712e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar5 = pVVar10->pArray[uVar16];
            if ((iVar5 < 0) || (pGVar2->nObjs <= iVar5)) goto LAB_002f710f;
            cVar1 = local_48[uVar16];
            if ((cVar1 < '\0') || (pLib->vCis->nSize <= (int)cVar1)) goto LAB_002f712e;
            iVar6 = pLib->vCis->pArray[(uint)(int)cVar1];
            if (((long)iVar6 < 0) || (pLib->nObjs <= iVar6)) goto LAB_002f710f;
            pLib->pObjs[iVar6].Value = (uint)((uVar7 >> ((uint)uVar16 & 0x1f) & 1) != 0) + iVar5 * 2
            ;
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
          if (pLib->vTtNodes->nSize < 1) {
            __assert_fail("Vec_IntSize(pLib->vTtNodes) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x26e,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
          }
          pVVar10 = pLib->vTtNodes;
          if (0 < pVVar10->nSize) {
            lVar11 = 0;
            do {
              iVar5 = pVVar10->pArray[lVar11];
              if (((long)iVar5 < 0) || (pLib->nObjs <= iVar5)) goto LAB_002f710f;
              if (pLib->pObjs == (Gia_Obj_t *)0x0) {
                pGVar13 = (Gia_Obj_t *)0x0;
                break;
              }
              pGVar13 = pLib->pObjs + iVar5;
              uVar17 = *(ulong *)pGVar13;
              if ((int)pGVar13[-(ulong)((uint)uVar17 & 0x1fffffff)].Value < 0) goto LAB_002f716c;
              uVar8 = (uint)(uVar17 >> 0x20);
              if ((int)pGVar13[-(ulong)(uVar8 & 0x1fffffff)].Value < 0) goto LAB_002f716c;
              uVar8 = Gia_ManHashAnd(local_68,(uint)(uVar17 >> 0x1d) & 1 ^
                                              pGVar13[-(ulong)((uint)uVar17 & 0x1fffffff)].Value,
                                     pGVar13[-(ulong)(uVar8 & 0x1fffffff)].Value ^ uVar8 >> 0x1d & 1
                                    );
              pGVar13->Value = uVar8;
              lVar11 = lVar11 + 1;
              pVVar10 = pLib->vTtNodes;
            } while (lVar11 < pVVar10->nSize);
          }
          iVar5 = clock_gettime(3,&local_98);
          pGVar2 = local_68;
          pLVar4 = local_88;
          if (iVar5 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
          }
          local_88->timeBuild = local_88->timeBuild + lVar11 + local_80;
          if (((int)(uint)*(ulong *)pGVar13 < 0) ||
             (((uint)*(ulong *)pGVar13 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pTemp)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x278,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
          }
          if ((int)pGVar13->Value < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar8 = pGVar13->Value >> 1;
          if (local_68->nObjs <= (int)uVar8) {
LAB_002f710f:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar17 = *(ulong *)(local_68->pObjs + uVar8);
          if ((uVar17 & 0x4000000000000000) == 0) {
            *(ulong *)(local_68->pObjs + uVar8) = uVar17 | 0x4000000000000000;
            if ((int)pGVar13->Value < 0) {
LAB_002f716c:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            Gia_ManAppendCo(local_68,pGVar13->Value ^
                                     (uint)((uVar7 >> ((uint)local_78 & 0x1f) & 1) != 0));
            iVar5 = clock_gettime(3,&local_98);
            if (iVar5 < 0) {
              lVar11 = 1;
            }
            else {
              lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
              lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_98.tv_sec * -1000000;
            }
            iVar5 = Vec_MemHashInsert(pLVar4->vTtMem,pTruth);
            Vec_IntPush(pLVar4->vTruthIds,iVar5);
            if (pGVar2->vCos->nSize != pLVar4->vTruthIds->nSize) {
              __assert_fail("Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                            ,0x29f,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
            }
            pLVar4->nAdded = pLVar4->nAdded + 1;
            iVar5 = clock_gettime(3,&local_98);
            if (iVar5 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
            }
            pLVar4->timeInsert = pLVar4->timeInsert + lVar12 + lVar11;
          }
          else {
            local_88->nFilterSame = local_88->nFilterSame + 1;
          }
        }
        lVar11 = local_70 + 1;
        pVVar10 = pLib->vCos;
        __ptr = local_58;
      } while (lVar11 < pVVar10->nSize);
    }
    if (__ptr->pArray != (char *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (char *)0x0;
    }
    if (__ptr != (Vec_Str_t *)0x0) {
      free(__ptr);
    }
    iVar5 = clock_gettime(3,&local_98);
    if (iVar5 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    local_88->timeTotal = local_88->timeTotal + lVar11 + local_60;
  }
  else {
    printf("The number of Library inputs (%d) differs from the number of Gia inputs (%d).\n");
  }
  return;
}

Assistant:

void Abc_NtkRecLibMerge3( Gia_Man_t * pLib )
{
    int fCheck = 0;
    Lms_Man_t * p = s_pMan3;
    Gia_Man_t * pGia = p->pGia;
    Vec_Str_t * vSupps;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    word * pTruth;
    int i, k, Index, iFanin0, iFanin1, nLeaves;
    Gia_Obj_t * pObjPo, * pDriver, * pTemp = NULL;
    abctime clk, clk2 = Abc_Clock();

    if ( Gia_ManCiNum(pLib) != Gia_ManCiNum(pGia) )
    {
        printf( "The number of Library inputs (%d) differs from the number of Gia inputs (%d).\n", Gia_ManCiNum(pLib), Gia_ManCiNum(pGia) );
        return;
    }
    assert( Gia_ManCiNum(pLib) == Gia_ManCiNum(pGia) );

    // create hash table if not available
    if ( Vec_IntSize(&pGia->vHTable) == 0 )
        Gia_ManHashStart( pGia );

    // add AIG subgraphs
    vSupps = Lms_GiaSuppSizes( pLib );
    Gia_ManForEachCo( pLib, pObjPo, k )
    {
        // get support size
        nLeaves = Vec_StrEntry(vSupps, k);
        assert( nLeaves > 1 );

        // compute the truth table
clk = Abc_Clock();
        pTruth = Gia_ObjComputeTruthTable( pLib, Gia_ObjFanin0(pObjPo) );
p->timeTruth += Abc_Clock() - clk;
        // semi-canonicize
clk = Abc_Clock();
        memcpy( p->pTemp1, pTruth, p->nWords * sizeof(word) );
#ifdef LMS_USE_OLD_FORM
        uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pTemp1, (unsigned *)p->pTemp2, nLeaves, pCanonPerm );
#else
        uCanonPhase = Abc_TtCanonicize( p->pTemp1, nLeaves, pCanonPerm );
#endif
        Abc_TtStretch5( (unsigned *)p->pTemp1, nLeaves, p->nVars );
p->timeCanon += Abc_Clock() - clk;
        // pCanonPerm and uCanonPhase show what was the variable corresponding to each var in the current truth
        if ( nLeaves == 2 && Abc_TtSupportSize(pTruth, 2) != 2 )
            continue;

clk = Abc_Clock();
        // map cut leaves into elementary variables of GIA
        for ( i = 0; i < nLeaves; i++ )
            Gia_ManCi( pLib, pCanonPerm[i] )->Value = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManPi(pGia, i)), (uCanonPhase >> i) & 1 );
        // build internal nodes
        assert( Vec_IntSize(pLib->vTtNodes) > 0 );
        Gia_ManForEachObjVec( pLib->vTtNodes, pLib, pTemp, i )
        {
            iFanin0 = Abc_LitNotCond( Gia_ObjFanin0(pTemp)->Value, Gia_ObjFaninC0(pTemp) );
            iFanin1 = Abc_LitNotCond( Gia_ObjFanin1(pTemp)->Value, Gia_ObjFaninC1(pTemp) );
            pTemp->Value = Gia_ManHashAnd( pGia, iFanin0, iFanin1 );
        }
p->timeBuild += Abc_Clock() - clk;

        // check if this node is already driving a PO
        assert( Gia_ObjIsAnd(pTemp) );
        pDriver = Gia_ManObj(pGia, Abc_Lit2Var(pTemp->Value));
        if ( pDriver->fMark1 )
        {
            p->nFilterSame++;
            continue;
        }
        pDriver->fMark1 = 1;
        // create output
        Gia_ManAppendCo( pGia, Abc_LitNotCond( pTemp->Value, (uCanonPhase >> nLeaves) & 1 ) );

        // verify truth table
        if ( fCheck )
        {
clk = Abc_Clock();
        pTemp = Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1);
        pTruth = Gia_ObjComputeTruthTable( pGia, Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1) );
p->timeCheck += Abc_Clock() - clk;
        if ( memcmp( p->pTemp1, pTruth, p->nWords * sizeof(word) ) != 0 )
        {
    
            Kit_DsdPrintFromTruth( (unsigned *)pTruth, nLeaves ); printf( "\n" );
            Kit_DsdPrintFromTruth( (unsigned *)p->pTemp1, nLeaves ); printf( "\n" );
            printf( "Truth table verification has failed.\n" );
    
            // drive PO with constant
            Gia_ManPatchCoDriver( pGia, Gia_ManCoNum(pGia)-1, 0 );
            // save truth table ID
            Vec_IntPush( p->vTruthIds, -1 );
            p->nFilterTruth++;
            continue;
        }
        }

clk = Abc_Clock();
        // add the resulting truth table to the hash table 
        Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
        // save truth table ID
        Vec_IntPush( p->vTruthIds, Index );
        assert( Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds) );
        p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
    }
    Vec_StrFree( vSupps );
p->timeTotal += Abc_Clock() - clk2;
}